

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

uint32_t map_get_uint32(map *map,void *key,natwm_error *error)

{
  map_entry *pmVar1;
  uint32_t local_2c [2];
  uint32_t index;
  
  local_2c[0] = 0;
  map_search(map,key,local_2c);
  pmVar1 = map->entries[local_2c[0]];
  *error = NO_ERROR;
  return *pmVar1->value;
}

Assistant:

uint32_t map_get_uint32(const struct map *map, const void *key, enum natwm_error *error)
{
        struct map_entry *entry = map_get(map, key);

        if (entry == NULL) {
                *error = NOT_FOUND_ERROR;
        }

        *error = NO_ERROR;

        return *(uint32_t *)entry->value;
}